

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

MetadataResult ExitProcess(ShellState *state,char **azArg,idx_t nArg)

{
  sqlite3_int64 sVar1;
  ulong in_RDX;
  char *in_RDI;
  int rc;
  undefined1 local_1;
  
  if (in_RDX < 2) {
    if (1 < in_RDX) {
      sVar1 = integerValue(in_RDI);
      if ((int)sVar1 != 0) {
        exit((int)sVar1);
      }
    }
    local_1 = EXIT;
  }
  else {
    local_1 = PRINT_USAGE;
  }
  return local_1;
}

Assistant:

MetadataResult ExitProcess(ShellState &state, const char **azArg, idx_t nArg) {
	if (nArg >= 2) {
		return MetadataResult::PRINT_USAGE;
	}
	int rc = 0;
	if (nArg > 1 && (rc = (int)integerValue(azArg[1])) != 0) {
		// exit immediately if a custom error code is provided
		exit(rc);
	}
	return MetadataResult::EXIT;
}